

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

iterator * __thiscall
gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::
end(iterator *__return_storage_ptr__,
   StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_> *this)

{
  int iVar1;
  Translator **ppTVar2;
  Translator *pTVar3;
  
  iVar1 = this->bsize;
  ppTVar2 = this->dataptr;
  if ((long)iVar1 == 0x20) {
    if (ppTVar2 == (Translator **)0x0) {
      ppTVar2 = &end::emptyValue;
    }
    else {
      ppTVar2 = ppTVar2 + (long)this->dataSlotIndex + 1;
    }
    pTVar3 = *ppTVar2;
    iVar1 = 0;
  }
  else {
    ppTVar2 = ppTVar2 + this->dataSlotIndex;
    pTVar3 = *ppTVar2 + iVar1;
  }
  __return_storage_ptr__->vec = ppTVar2;
  __return_storage_ptr__->ptr = pTVar3;
  __return_storage_ptr__->offset = iVar1;
  return __return_storage_ptr__;
}

Assistant:

iterator end()
        {
            static X* emptyValue{nullptr};
            if (bsize == blockSize) {
                X** ptr = (dataptr != nullptr) ? &(dataptr[dataSlotIndex + 1]) :
                                                 &emptyValue;
                return {ptr, 0};
            }
            X** ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }